

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quest.cpp
# Opt level: O2

const_iterator __thiscall
Quest_Context::UnserializeProgress(Quest_Context *this,const_iterator it,const_iterator end)

{
  char cVar1;
  short sVar2;
  mapped_type *pmVar3;
  const_iterator cVar4;
  bool bVar5;
  bool bVar6;
  string key;
  key_type local_50;
  
  if ((it._M_current != end._M_current) && (*it._M_current == '{')) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    local_50._M_string_length = 0;
    local_50.field_2._M_local_buf[0] = '\0';
    bVar5 = true;
    bVar6 = false;
    sVar2 = 0;
    cVar4._M_current = it._M_current;
    while (it._M_current = cVar4._M_current + 1, it._M_current != end._M_current) {
      cVar1 = *it._M_current;
      if (cVar1 == 0x7d) break;
      cVar4._M_current = it._M_current;
      if (bVar5) {
        bVar5 = cVar1 != '=';
        if (bVar5) {
          std::__cxx11::string::push_back((char)&local_50);
        }
        bVar6 = cVar1 == '=';
      }
      else {
        bVar5 = cVar1 == ',';
        if (bVar5) {
          pmVar3 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>_>
                   ::operator[](&this->progress,&local_50);
          *pmVar3 = sVar2;
          std::__cxx11::string::assign((char *)&local_50);
          sVar2 = 0;
        }
        else {
          sVar2 = sVar2 * 10 + (short)cVar1 + -0x30;
        }
        bVar6 = cVar1 != ',';
      }
    }
    if (bVar6) {
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>_>
               ::operator[](&this->progress,&local_50);
      *pmVar3 = sVar2;
    }
    if (it._M_current != end._M_current) {
      it._M_current = cVar4._M_current + 2;
    }
    std::__cxx11::string::~string((string *)&local_50);
  }
  return (const_iterator)it._M_current;
}

Assistant:

std::string::const_iterator Quest_Context::UnserializeProgress(std::string::const_iterator it, std::string::const_iterator end)
{
	if (it == end || *it != '{')
		return it;

	++it;

	std::string key;
	short value = 0;
	int state = 0;

	for (; it != end && *it != '}'; ++it)
	{
		if (state == 0) // Reading key
		{
			if (*it == '=')
			{
				state = 1;
			}
			else
			{
				key += *it;
			}
		}
		else if (state == 1) // Reading value
		{
			if (*it == ',')
			{
				this->progress[key] = value;
				key = "";
				value = 0;
				state = 0;
			}
			else
			{
				value *= 10;
				value += *it - '0';
			}
		}
	}

	if (state == 1)
		this->progress[key] = value;

	if (it != end)
		++it;

	return it;
}